

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialHexaANCF.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMaterialHexaANCF::Calc_D
          (ChMaterialHexaANCF *this,ChVector<double> *E,ChVector<double> *nu,ChVector<double> *G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  dVar1 = nu->m_data[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = nu->m_data[1];
  dVar14 = nu->m_data[2];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar14;
  dVar2 = E->m_data[0];
  dVar3 = E->m_data[1];
  auVar7._0_8_ = (dVar1 * dVar3) / dVar2;
  auVar7._8_8_ = 0;
  dVar4 = E->m_data[2];
  auVar13._0_8_ = (nu->m_data[1] * dVar4) / dVar2;
  auVar13._8_8_ = 0;
  auVar16._0_8_ = (dVar14 * dVar4) / dVar3;
  auVar16._8_8_ = 0;
  auVar8 = ZEXT816(0x3ff0000000000000);
  auVar11 = vfnmadd213sd_fma(auVar16,auVar12,auVar8);
  auVar17 = vfnmadd213sd_fma(auVar7,auVar6,auVar11);
  auVar17 = vfnmadd231sd_fma(auVar17,auVar10,auVar13);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar14 * dVar1;
  auVar17 = vfnmadd213sd_fma(auVar20,auVar13,auVar17);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = auVar16._0_8_ * auVar7._0_8_;
  auVar17 = vfnmadd213sd_fma(auVar15,auVar10,auVar17);
  dVar14 = auVar17._0_8_;
  auVar19._0_8_ = (auVar11._0_8_ * dVar2) / dVar14;
  auVar19._8_8_ = 0;
  auVar20 = vfmadd213sd_fma(auVar16,auVar7,auVar13);
  auVar5 = vfmadd213sd_fma(auVar13,auVar6,auVar16);
  auVar11 = vfmadd213sd_fma(auVar16,auVar10,auVar6);
  auVar17._0_8_ = (auVar11._0_8_ * dVar3) / dVar14;
  auVar17._8_8_ = 0;
  auVar11 = vfmadd213sd_fma(auVar12,auVar6,auVar10);
  auVar23._0_8_ = (auVar11._0_8_ * dVar4) / dVar14;
  auVar23._8_8_ = 0;
  auVar11 = vfmadd213sd_fma(auVar13,auVar12,auVar7);
  auVar21._0_8_ = (auVar11._0_8_ * dVar2) / dVar14;
  auVar21._8_8_ = 0;
  auVar15 = vunpcklpd_avx(auVar19,auVar21);
  auVar11 = vfnmadd213sd_fma(auVar13,auVar10,auVar8);
  auVar22._0_8_ = (auVar11._0_8_ * dVar3) / dVar14;
  auVar22._8_8_ = 0;
  auVar11 = vunpcklpd_avx(auVar17,auVar22);
  auVar13 = ZEXT816(0);
  auVar18._16_16_ = auVar11;
  auVar18._0_16_ = auVar13;
  auVar11 = vfmadd213sd_fma(auVar10,auVar7,auVar12);
  auVar11._0_8_ = (dVar4 * auVar11._0_8_) / dVar14;
  auVar11._8_8_ = 0;
  auVar10 = vunpcklpd_avx(auVar23,auVar11);
  auVar6 = vfnmadd213sd_fma(auVar7,auVar6,auVar8);
  auVar11 = vmovhpd_avx(ZEXT816(0) << 0x40,G->m_data[2]);
  dVar1 = G->m_data[1];
  auVar17 = vmovhpd_avx(ZEXT816(0) << 0x40,G->m_data[0]);
  auVar9._16_16_ = auVar17;
  auVar9._0_16_ = auVar13;
  *(undefined1 (*) [16])
   (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array =
       auVar15;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2]
       = (auVar20._0_8_ * dVar2) / dVar14;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[3]
       = 0.0;
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 4) = auVar18;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[8]
       = (auVar5._0_8_ * dVar3) / dVar14;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9]
       = 0.0;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [10] = 0.0;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xb] = 0.0;
  *(undefined1 (*) [16])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0xc) = auVar10;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xe] = (dVar4 * auVar6._0_8_) / dVar14;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xf] = 0.0;
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x10) = ZEXT1632(auVar13);
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x14) = ZEXT1632(auVar11);
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x18) = ZEXT1632(auVar13);
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = dVar1;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x20) = auVar9;
  return;
}

Assistant:

void ChMaterialHexaANCF::Calc_D(const ChVector<>& E, const ChVector<>& nu, const ChVector<>& G) {
    // orthotropic material ref: http://homes.civil.aau.dk/lda/Continuum/material.pdf
    // except position of the shear terms is different to match the original ANCF reference paper

    double nu_12 = nu.x();
    double nu_13 = nu.y();
    double nu_23 = nu.z();
    double nu_21 = nu_12 * E.y() / E.x();
    double nu_31 = nu_13 * E.z() / E.x();
    double nu_32 = nu_23 * E.z() / E.y();
    double k = 1.0 - nu_23 * nu_32 - nu_12 * nu_21 - nu_13 * nu_31 - nu_12 * nu_23 * nu_31 - nu_21 * nu_32 * nu_13;

    ChMatrixNM<double, 6, 6> D;
    D.setZero();
    D(0, 0) = E.x() * (1 - nu_23 * nu_32) / k;
    D(1, 0) = E.y() * (nu_13 * nu_32 + nu_12) / k;
    D(2, 0) = E.z() * (nu_12 * nu_23 + nu_13) / k;

    D(0, 1) = E.x() * (nu_23 * nu_31 + nu_21) / k;
    D(1, 1) = E.y() * (1 - nu_13 * nu_31) / k;
    D(2, 1) = E.z() * (nu_13 * nu_21 + nu_23) / k;

    D(0, 2) = E.x() * (nu_21 * nu_32 + nu_31) / k;
    D(1, 2) = E.y() * (nu_12 * nu_31 + nu_32) / k;
    D(2, 2) = E.z() * (1 - nu_12 * nu_21) / k;

    D(3, 3) = G.z();
    D(4, 4) = G.y();
    D(5, 5) = G.x();

    m_D = D;
}